

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_wrapper_v(uchar *script,size_t script_len,size_t *write_len)

{
  ulong uVar1;
  size_t sVar2;
  uchar uVar3;
  
  sVar2 = *write_len;
  if (sVar2 == 0) {
    return -2;
  }
  uVar3 = script[sVar2 - 1];
  if (uVar3 == 0x87) {
    uVar3 = 0x88;
  }
  else if (uVar3 == 0xae) {
    uVar3 = 0xaf;
  }
  else if (uVar3 == 0xac) {
    uVar3 = 0xad;
  }
  else {
    if (uVar3 != 0x9c) {
      uVar1 = sVar2 + 1;
      if (script_len < uVar1) {
        return -2;
      }
      script[sVar2] = 'i';
      *write_len = uVar1;
      if (uVar1 < 0x2711) {
        return 0;
      }
      return -2;
    }
    uVar3 = 0x9d;
  }
  script[sVar2 - 1] = uVar3;
  return 0;
}

Assistant:

static int generate_by_wrapper_v(
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    size_t used_len = *write_len;
    if (!used_len)
        return WALLY_EINVAL;

    if (script[used_len - 1] == OP_EQUAL) {
        script[used_len - 1] = OP_EQUALVERIFY;
    } else if (script[used_len - 1] == OP_NUMEQUAL) {
        script[used_len - 1] = OP_NUMEQUALVERIFY;
    } else if (script[used_len - 1] == OP_CHECKSIG) {
        script[used_len - 1] = OP_CHECKSIGVERIFY;
    } else if (script[used_len - 1] == OP_CHECKMULTISIG) {
        script[used_len - 1] = OP_CHECKMULTISIGVERIFY;
    } else if ((used_len + 1) > script_len) {
        return WALLY_EINVAL;
    } else {
        script[used_len] = OP_VERIFY;
        *write_len = used_len + 1;
        if (*write_len > DESCRIPTOR_WITNESS_SCRIPT_MAX_SIZE)
            return WALLY_EINVAL;
    }
    return WALLY_OK;
}